

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  char *pcVar5;
  long *local_70;
  ICustomPlugin *customPlugin;
  IPlugin *plugin;
  char *pluginFilename;
  char **__end1;
  char **__begin1;
  char *(*__range1) [3];
  char *plugins [3];
  
  plugins[2]._4_4_ = 0;
  __range1 = (char *(*) [3])anon_var_dwarf_689;
  plugins[0] = "pluginB";
  plugins[1] = "pluginC";
  poVar3 = std::operator<<((ostream *)&std::cout,"Starting Plugin Manager...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (__end1 = (char **)&__range1; __end1 != plugins + 2; __end1 = __end1 + 1) {
    pcVar1 = *__end1;
    poVar3 = std::operator<<((ostream *)&std::cout,"========= ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    poVar3 = std::operator<<(poVar3," =========");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    plVar4 = (long *)IPluginManager::Get();
    plVar4 = (long *)(**(code **)(*plVar4 + 0x10))(plVar4,pcVar1);
    if (plVar4 != (long *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Plugin name: ");
      pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))();
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      if (plVar4 == (long *)0x0) {
        local_70 = (long *)0x0;
      }
      else {
        local_70 = (long *)__dynamic_cast(plVar4,&IPlugin::typeinfo,&ICustomPlugin::typeinfo,0);
      }
      if (local_70 == (long *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Plugin does not implement ICustomPlugin.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        (**(code **)(*local_70 + 0x18))(local_70,"Agustin");
        poVar3 = std::operator<<((ostream *)&std::cout,"Plugin->doSomething(4, 5) = ");
        iVar2 = (**(code **)(*local_70 + 0x20))(local_70,4,5);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      plVar4 = (long *)IPluginManager::Get();
      (**(code **)(*plVar4 + 0x18))(plVar4,pcVar1);
    }
  }
  std::istream::get();
  return 0;
}

Assistant:

int main()
{
	const char* plugins[] = { "pluginA", "pluginB", "pluginC" };

	std::cout << "Starting Plugin Manager..." << std::endl;
	for ( const auto pluginFilename : plugins )
	{
		std::cout << "========= " << pluginFilename << " =========" << std::endl;
		if ( IPlugin* plugin = IPluginManager::Get()->loadPlugin( pluginFilename ) )
		{
			std::cout << "Plugin name: " << plugin->name() << std::endl;
			if ( ICustomPlugin* customPlugin = dynamic_cast<ICustomPlugin*>( plugin ) )
			{
				customPlugin->sayHelloTo( "Agustin" );
				std::cout << "Plugin->doSomething(4, 5) = " << customPlugin->doSomething( 4, 5 ) << std::endl;
			}
			else
			{
				std::cout << "Plugin does not implement ICustomPlugin." << std::endl;
			}
			IPluginManager::Get()->unloadPlugin( pluginFilename );
		}
	}

	std::cin.get();
	return 0;
}